

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.cpp
# Opt level: O1

void __thiscall CPU::Z80::State::Registers::Registers(Registers *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string local_30;
  
  (this->super_StructImpl<CPU::Z80::State::Registers>).super_Struct._vptr_Struct =
       (_func_int **)&PTR_all_keys_abi_cxx11__005a9ba0;
  if (Reflection::StructImpl<CPU::Z80::State::Registers>::contents__abi_cxx11_._M_h._M_element_count
      == 0) {
    paVar1 = &local_30.field_2;
    local_30._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"a","");
    Reflection::StructImpl<CPU::Z80::State::Registers>::declare_emplace<unsigned_char>
              (&this->super_StructImpl<CPU::Z80::State::Registers>,&this->a,&local_30,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != paVar1) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    local_30._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"flags","");
    Reflection::StructImpl<CPU::Z80::State::Registers>::declare_emplace<unsigned_char>
              (&this->super_StructImpl<CPU::Z80::State::Registers>,&this->flags,&local_30,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != paVar1) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    local_30._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"bc","");
    Reflection::StructImpl<CPU::Z80::State::Registers>::declare_emplace<unsigned_short>
              (&this->super_StructImpl<CPU::Z80::State::Registers>,&this->bc,&local_30,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != paVar1) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    local_30._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"de","");
    Reflection::StructImpl<CPU::Z80::State::Registers>::declare_emplace<unsigned_short>
              (&this->super_StructImpl<CPU::Z80::State::Registers>,&this->de,&local_30,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != paVar1) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    local_30._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"hl","");
    Reflection::StructImpl<CPU::Z80::State::Registers>::declare_emplace<unsigned_short>
              (&this->super_StructImpl<CPU::Z80::State::Registers>,&this->hl,&local_30,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != paVar1) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    local_30._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"af_dash","");
    Reflection::StructImpl<CPU::Z80::State::Registers>::declare_emplace<unsigned_short>
              (&this->super_StructImpl<CPU::Z80::State::Registers>,&this->af_dash,&local_30,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != paVar1) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    local_30._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"bc_dash","");
    Reflection::StructImpl<CPU::Z80::State::Registers>::declare_emplace<unsigned_short>
              (&this->super_StructImpl<CPU::Z80::State::Registers>,&this->bc_dash,&local_30,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != paVar1) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    local_30._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"de_dash","");
    Reflection::StructImpl<CPU::Z80::State::Registers>::declare_emplace<unsigned_short>
              (&this->super_StructImpl<CPU::Z80::State::Registers>,&this->de_dash,&local_30,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != paVar1) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    local_30._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"hl_dash","");
    Reflection::StructImpl<CPU::Z80::State::Registers>::declare_emplace<unsigned_short>
              (&this->super_StructImpl<CPU::Z80::State::Registers>,&this->hl_dash,&local_30,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != paVar1) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    local_30._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"ix","");
    Reflection::StructImpl<CPU::Z80::State::Registers>::declare_emplace<unsigned_short>
              (&this->super_StructImpl<CPU::Z80::State::Registers>,&this->ix,&local_30,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != paVar1) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    local_30._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"iy","");
    Reflection::StructImpl<CPU::Z80::State::Registers>::declare_emplace<unsigned_short>
              (&this->super_StructImpl<CPU::Z80::State::Registers>,&this->iy,&local_30,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != paVar1) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    local_30._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"ir","");
    Reflection::StructImpl<CPU::Z80::State::Registers>::declare_emplace<unsigned_short>
              (&this->super_StructImpl<CPU::Z80::State::Registers>,&this->ir,&local_30,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != paVar1) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    local_30._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"program_counter","");
    Reflection::StructImpl<CPU::Z80::State::Registers>::declare_emplace<unsigned_short>
              (&this->super_StructImpl<CPU::Z80::State::Registers>,&this->program_counter,&local_30,
               1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != paVar1) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    local_30._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"stack_pointer","");
    Reflection::StructImpl<CPU::Z80::State::Registers>::declare_emplace<unsigned_short>
              (&this->super_StructImpl<CPU::Z80::State::Registers>,&this->stack_pointer,&local_30,1)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != paVar1) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    local_30._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"interrupt_mode","");
    Reflection::StructImpl<CPU::Z80::State::Registers>::declare_emplace<int>
              (&this->super_StructImpl<CPU::Z80::State::Registers>,&this->interrupt_mode,&local_30,1
              );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != paVar1) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    local_30._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"iff1","");
    Reflection::StructImpl<CPU::Z80::State::Registers>::declare_emplace<bool>
              (&this->super_StructImpl<CPU::Z80::State::Registers>,&this->iff1,&local_30,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != paVar1) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    local_30._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"iff2","");
    Reflection::StructImpl<CPU::Z80::State::Registers>::declare_emplace<bool>
              (&this->super_StructImpl<CPU::Z80::State::Registers>,&this->iff2,&local_30,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != paVar1) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    local_30._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"memptr","");
    Reflection::StructImpl<CPU::Z80::State::Registers>::declare_emplace<unsigned_short>
              (&this->super_StructImpl<CPU::Z80::State::Registers>,&this->memptr,&local_30,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != paVar1) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

State::Registers::Registers() {
	if(needs_declare()) {
		DeclareField(a);
		DeclareField(flags);
		DeclareField(bc);
		DeclareField(de);
		DeclareField(hl);
		DeclareField(af_dash);	// TODO: is there any disadvantage to declaring these for reflective
		DeclareField(bc_dash);	// purposes as AF', BC', etc?
		DeclareField(de_dash);
		DeclareField(hl_dash);
		DeclareField(ix);
		DeclareField(iy);
		DeclareField(ir);
		DeclareField(program_counter);
		DeclareField(stack_pointer);
		DeclareField(interrupt_mode);
		DeclareField(iff1);
		DeclareField(iff2);
		DeclareField(memptr);
	}
}